

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::Next
          (NodeSet *this,int32_t *cursor,int32_t *elem)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  
  piVar3 = (this->table_).ptr_;
  uVar5 = (ulong)(uint)*cursor;
  do {
    uVar1 = (this->table_).size_;
    uVar4 = (uint)uVar5;
    if (uVar1 <= uVar4) goto LAB_003f4724;
    iVar2 = piVar3[uVar5];
    uVar5 = uVar5 + 1;
    *cursor = (int32_t)uVar5;
  } while (iVar2 < 0);
  *elem = iVar2;
LAB_003f4724:
  return uVar4 < uVar1;
}

Assistant:

bool Next(int32_t* cursor, int32_t* elem) {
    while (static_cast<uint32_t>(*cursor) < table_.size()) {
      int32_t v = table_[static_cast<uint32_t>(*cursor)];
      (*cursor)++;
      if (v >= 0) {
        *elem = v;
        return true;
      }
    }
    return false;
  }